

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1538.c
# Opt level: O3

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  
  curl_easy_strerror(0x7fffffff);
  curl_multi_strerror(0x7fffffff);
  curl_share_strerror(0x7fffffff);
  curl_easy_strerror(0x80000001);
  curl_multi_strerror(0x80000001);
  curl_share_strerror(0x80000001);
  iVar2 = 0;
  do {
    uVar1 = curl_easy_strerror(iVar2);
    curl_mprintf("e%d: %s\n",iVar2,uVar1);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 0x5f);
  iVar2 = -1;
  do {
    uVar1 = curl_multi_strerror(iVar2);
    curl_mprintf("m%d: %s\n",iVar2,uVar1);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 10);
  iVar2 = 0;
  do {
    uVar1 = curl_share_strerror(iVar2);
    curl_mprintf("s%d: %s\n",iVar2,uVar1);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 7);
  return 0;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURLcode easyret;
  CURLMcode multiret;
  CURLSHcode shareret;
  (void)URL;

  curl_easy_strerror(INT_MAX);
  curl_multi_strerror(INT_MAX);
  curl_share_strerror(INT_MAX);
  curl_easy_strerror(-INT_MAX);
  curl_multi_strerror(-INT_MAX);
  curl_share_strerror(-INT_MAX);
  for(easyret = CURLE_OK; easyret <= CURL_LAST; easyret++) {
    printf("e%d: %s\n", (int)easyret, curl_easy_strerror(easyret));
  }
  for(multiret = CURLM_CALL_MULTI_PERFORM; multiret <= CURLM_LAST;
      multiret++) {
    printf("m%d: %s\n", (int)multiret, curl_multi_strerror(multiret));
  }
  for(shareret = CURLSHE_OK; shareret <= CURLSHE_LAST; shareret++) {
    printf("s%d: %s\n", (int)shareret, curl_share_strerror(shareret));
  }

  return (int)res;
}